

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

double RDL_countPaths(uint a,uint b,uint V,RDL_sPathInfo *spi)

{
  uint *puVar1;
  size_t __size;
  double dVar2;
  uint uVar3;
  RDL_graph *pRVar4;
  uint *puVar5;
  RDL_edge *paRVar6;
  void *__s;
  uint *indegree;
  uint *__ptr;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar8 = (ulong)V;
  __s = malloc(uVar8 * 8);
  __size = uVar8 * 4;
  indegree = (uint *)malloc(__size);
  __ptr = (uint *)malloc(__size);
  if (V == 0) {
    RDL_findIndegree(a,b,indegree,spi);
  }
  else {
    uVar12 = 0;
    memset(__s,0,uVar8 * 8);
    memset(indegree,0xff,__size);
    RDL_findIndegree(a,b,indegree,spi);
    uVar7 = 0;
    do {
      if (indegree[uVar12] == 0) {
        __ptr[uVar7] = (uint)uVar12;
        uVar7 = uVar7 + 1;
        *(undefined8 *)((long)__s + uVar12 * 8) = 0x3ff0000000000000;
      }
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
    if ((uVar7 == 1) && (*__ptr == b)) {
      pRVar4 = spi->dPaths[a];
      puVar5 = pRVar4->degree;
      uVar8 = 1;
      do {
        uVar8 = (ulong)((int)uVar8 - 1);
        uVar12 = (ulong)__ptr[uVar8];
        uVar9 = (ulong)puVar5[uVar12];
        if (uVar9 != 0) {
          paRVar6 = pRVar4->adjList[uVar12];
          uVar10 = 0;
          do {
            uVar3 = paRVar6[uVar10][0];
            uVar11 = (ulong)uVar3;
            puVar1 = indegree + uVar11;
            *puVar1 = *puVar1 - 1;
            uVar7 = *puVar1;
            *(double *)((long)__s + uVar11 * 8) =
                 *(double *)((long)__s + uVar12 * 8) + *(double *)((long)__s + uVar11 * 8);
            if (uVar7 == 0) {
              __ptr[uVar8] = uVar3;
              uVar8 = (ulong)((int)uVar8 + 1);
            }
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      } while ((int)uVar8 != 0);
      dVar2 = *(double *)((long)__s + (ulong)a * 8);
      free(__s);
      free(indegree);
      free(__ptr);
      return dVar2;
    }
  }
  (*RDL_outputFunc)(RDL_ERROR,"invalid topological sort!");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                ,0x5c,
                "double RDL_countPaths(unsigned int, unsigned int, unsigned int, const RDL_sPathInfo *)"
               );
}

Assistant:

double RDL_countPaths(unsigned a, unsigned b,
    unsigned V, const RDL_sPathInfo *spi)
{
  unsigned i, curr, vertex, empty_end=0;
  unsigned *indegree, *empty_set;
  double *nof_paths, result;

  nof_paths = malloc(V * sizeof(*nof_paths));
  indegree = malloc(V * sizeof(*indegree));
  empty_set = malloc(V * sizeof(*empty_set));
  for (i = 0; i < V; ++i) {
    nof_paths[i] = 0.0;
    indegree[i] = UINT_MAX;
  }

  RDL_findIndegree(a, b, indegree, spi);

  for (i = 0; i < V; ++i) {
    if (indegree[i] == 0) {
      empty_set[empty_end] = i;
      ++empty_end;
      nof_paths[i] = 1.0;
    }
  }

  if (empty_end != 1 || empty_set[0] != b) {
    RDL_outputFunc(RDL_ERROR, "invalid topological sort!");
    /* should never happen */
    assert(0);
    free(nof_paths);
    free(indegree);
    free(empty_set);
    return DBL_MAX;
  }

  /* look at the nodes in an topological sort */
  while (empty_end) {
    curr = empty_set[empty_end-1];
    --empty_end;
    for(i=0; i<spi->dPaths[a]->degree[curr]; ++i) {
      vertex = spi->dPaths[a]->adjList[curr][i][0];
      --indegree[vertex];
      nof_paths[vertex] += nof_paths[curr];
      if (!indegree[vertex]) {
        empty_set[empty_end] = vertex;
        ++empty_end;
      }
    }
  }

  result = nof_paths[a];

  free(nof_paths);
  free(indegree);
  free(empty_set);

  return result;
}